

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

int __thiscall
QPDF::processXRefSize
          (QPDF *this,QPDFObjectHandle *dict,int entry_size,
          function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long i;
  QPDFExc *pQVar3;
  int iVar4;
  longlong size;
  QPDFObjectHandle Size_obj;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  long local_58 [2];
  QPDFObjectHandle local_48;
  long local_38;
  QPDFObjectHandle local_30;
  
  auVar1 = (ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)entry_size);
  i = auVar1._0_8_;
  iVar4 = 0x7fffffff;
  if ((i < 0x7fffffff) && (iVar4 = auVar1._0_4_, iVar4 != i)) {
    QIntC::IntConverter<long_long,_int,_true,_true>::error(i);
  }
  local_68._M_len = (size_t)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/Size","");
  QPDFObjectHandle::getKey(&local_30,(string *)dict);
  if ((long *)local_68._M_len != local_58) {
    operator_delete((void *)local_68._M_len,local_58[0] + 1);
  }
  local_68._M_len = (size_t)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"/Size","");
  QPDFObjectHandle::getKey(&local_48,(string *)dict);
  bVar2 = QPDFObjectHandle::getValueAsInt(&local_48,&local_38);
  if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((long *)local_68._M_len != local_58) {
    operator_delete((void *)local_68._M_len,local_58[0] + 1);
  }
  if (bVar2) {
    if (local_38 < 0) {
      pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_68._M_len = 0x2f;
      local_68._M_str = "Cross-reference stream has a negative /Size key";
      if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*damaged->_M_invoker)(pQVar3,(_Any_data *)damaged,&local_68);
    }
    else {
      if (local_38 < iVar4) {
        if (local_30.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_30.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        return iVar4;
      }
      pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
      local_68._M_len = 0x38;
      local_68._M_str = "Cross-reference stream has an impossibly large /Size key";
      if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*damaged->_M_invoker)(pQVar3,(_Any_data *)damaged,&local_68);
    }
  }
  else {
    pQVar3 = (QPDFExc *)__cxa_allocate_exception(0x80);
    local_68._M_len = 0x37;
    local_68._M_str = "Cross-reference stream does not have a proper /Size key";
    if ((damaged->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*damaged->_M_invoker)(pQVar3,(_Any_data *)damaged,&local_68);
  }
  __cxa_throw(pQVar3,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

int
QPDF::processXRefSize(
    QPDFObjectHandle& dict, int entry_size, std::function<QPDFExc(std::string_view)> damaged)
{
    // Number of entries is limited by the highest possible object id and stream size.
    auto max_num_entries = std::numeric_limits<int>::max();
    if (max_num_entries > (std::numeric_limits<qpdf_offset_t>::max() / entry_size)) {
        max_num_entries = toI(std::numeric_limits<qpdf_offset_t>::max() / entry_size);
    }

    auto Size_obj = dict.getKey("/Size");
    long long size;
    if (!dict.getKey("/Size").getValueAsInt(size)) {
        throw damaged("Cross-reference stream does not have a proper /Size key");
    } else if (size < 0) {
        throw damaged("Cross-reference stream has a negative /Size key");
    } else if (size >= max_num_entries) {
        throw damaged("Cross-reference stream has an impossibly large /Size key");
    }
    // We are not validating that Size <= (Size key of parent xref / trailer).
    return max_num_entries;
}